

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.hpp
# Opt level: O3

void __thiscall PCA::pca_model::pca_model(pca_model *this,ggml_tensor *t_input)

{
  int64_t iVar1;
  void *pvVar2;
  pointer pfVar3;
  int iVar4;
  ggml_backend_t pgVar5;
  ggml_context *pgVar6;
  ggml_tensor *pgVar7;
  ggml_backend_buffer_t pgVar8;
  undefined8 uVar9;
  size_type __n;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  undefined8 in_R8;
  undefined8 in_R9;
  float fVar15;
  vector<float,_std::allocator<float>_> random_vec;
  default_random_engine generator;
  undefined4 uVar16;
  undefined4 uVar17;
  float local_60;
  allocator_type local_59;
  vector<float,_std::allocator<float>_> local_58;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_40;
  long local_38;
  undefined8 uStack_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  this->backend = (ggml_backend_t)0x0;
  pgVar5 = (ggml_backend_t)ggml_backend_cpu_init();
  this->backend = pgVar5;
  local_38 = ggml_tensor_overhead();
  local_38 = local_38 << 2;
  uStack_30 = 0;
  local_28 = 1;
  uVar9 = CONCAT71(uStack_27,1);
  uStack_30._0_4_ = 0;
  uVar16 = (undefined4)local_38;
  uVar17 = (undefined4)uStack_30;
  pgVar6 = (ggml_context *)ggml_init();
  this->ctx = pgVar6;
  iVar1 = t_input->ne[1];
  pgVar7 = (ggml_tensor *)
           ggml_new_tensor_2d(pgVar6,0,t_input->ne[0],iVar1,in_R8,in_R9,uVar16,uVar17,uVar9);
  this->dev_input = pgVar7;
  pgVar7 = (ggml_tensor *)ggml_new_tensor_2d(this->ctx,0,iVar1,iVar1);
  this->dev_square = pgVar7;
  pgVar7 = (ggml_tensor *)ggml_new_tensor_1d(this->ctx,0,iVar1);
  this->dev_eigenvector = pgVar7;
  ggml_set_name(this->dev_input,"dev_input");
  ggml_set_name(this->dev_square,"dev_square");
  ggml_set_name(this->dev_eigenvector,"dev_eigenvector");
  pgVar8 = (ggml_backend_buffer_t)ggml_backend_alloc_ctx_tensors(this->ctx,this->backend);
  this->buffer = pgVar8;
  pgVar7 = this->dev_input;
  pvVar2 = t_input->data;
  uVar9 = ggml_nbytes(t_input);
  ggml_backend_tensor_set(pgVar7,pvVar2,0,uVar9);
  __n = ggml_nelements(this->dev_eigenvector);
  local_40._M_x = (ulong)local_40._M_x._4_4_ << 0x20;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_58,__n,(value_type_conflict3 *)&local_40,&local_59);
  uVar10 = time((time_t *)0x0);
  iVar4 = (int)uVar10;
  iVar12 = (int)((uVar10 & 0xffffffff) * 3 >> 0x20);
  uVar14 = ((uint)(iVar4 - iVar12) >> 1) + iVar12 >> 0x1e;
  uVar14 = uVar14 << 0x1f | uVar14;
  local_40._M_x = (unsigned_long)(uVar14 + iVar4 + (uint)(iVar4 + uVar14 == 0));
  local_60 = 0.0;
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar10 = 0;
    local_60 = 0.0;
    do {
      fVar15 = std::
               generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (&local_40);
      fVar15 = fVar15 + 0.0;
      local_60 = local_60 + fVar15 * fVar15;
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar10] = fVar15;
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)local_58.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_58.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_60 < 0.0) {
    local_60 = sqrtf(local_60);
  }
  else {
    local_60 = SQRT(local_60);
  }
  pfVar3 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar11 = (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar13 = 0;
    do {
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar13] =
           local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[lVar13] / local_60;
      lVar13 = lVar13 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
  }
  pgVar7 = this->dev_eigenvector;
  uVar9 = ggml_nbytes(pgVar7);
  ggml_backend_tensor_set(pgVar7,pfVar3,0,uVar9);
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

pca_model(struct ggml_tensor * t_input) {
#ifdef GGML_USE_CUDA
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        backend = ggml_backend_cuda_init(0); // init device 0
        if (!backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
#endif

// TODO: enable Metal support when support for GGML_OP_SQRT is added
// #ifdef GGML_USE_METAL
//         fprintf(stderr, "%s: using Metal backend\n", __func__);
//         backend = ggml_backend_metal_init();
//         if (!backend) {
//             fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
//         }
// #endif

        // if there aren't GPU Backends fallback to CPU backend
        if (!backend) {
            backend = ggml_backend_cpu_init();
        }

        const int num_tensors = 4;
        struct ggml_init_params params {
            /*.mem_size   =*/ ggml_tensor_overhead() * num_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };
        ctx = ggml_init(params);

        auto n_samples = t_input->ne[0];
        auto n_embd    = t_input->ne[1];

        dev_input       = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_samples, n_embd);
        dev_square      = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd,    n_embd);
        dev_eigenvector = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        ggml_set_name(dev_input,       "dev_input");
        ggml_set_name(dev_square,      "dev_square");
        ggml_set_name(dev_eigenvector, "dev_eigenvector");
        buffer = ggml_backend_alloc_ctx_tensors(ctx, backend);
        ggml_backend_tensor_set(dev_input, t_input->data, 0, ggml_nbytes(t_input));

        // initialize eigenvector to random normalized vector
        {
            std::vector<float> random_vec(ggml_nelements(dev_eigenvector), 0.0);
            std::default_random_engine generator(static_cast<unsigned int>(std::time(0)));
            std::uniform_real_distribution<float> distribution(0.0, 1.0);
            float sum_sqr = 0.0; // for normalizing random_vec
            for (size_t i = 0; i < random_vec.size(); ++i) {
                float f = distribution(generator);
                sum_sqr += f * f;
                random_vec[i] = f;
            }
            // normalize it
            float random_vec_norm = std::sqrt(sum_sqr);
            for (size_t i = 0; i < random_vec.size(); ++i) {
                random_vec[i] /= random_vec_norm;
            }
            ggml_backend_tensor_set(dev_eigenvector, random_vec.data(), 0, ggml_nbytes(dev_eigenvector));
        }
    }